

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_authority(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  curi_status local_54;
  curi_status subStatus;
  size_t initialOffset;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  __TRY_initialOffset._4_4_ = curi_status_success;
  sVar1 = *offset;
  cVar2 = parse_userinfo_and_at(uri,len,offset,settings,userData);
  if (cVar2 == curi_status_error) {
    *offset = sVar1;
    cVar2 = __TRY_initialOffset._4_4_;
  }
  __TRY_initialOffset._4_4_ = cVar2;
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    __TRY_initialOffset._4_4_ = parse_host(uri,len,offset,settings,userData);
  }
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    sVar1 = *offset;
    local_54 = parse_char(':',uri,len,offset,settings,userData);
    if (local_54 == curi_status_success) {
      local_54 = parse_port(uri,len,offset,settings,userData);
    }
    if (local_54 == curi_status_error) {
      *offset = sVar1;
    }
    else {
      __TRY_initialOffset._4_4_ = local_54;
    }
  }
  return __TRY_initialOffset._4_4_;
}

Assistant:

static curi_status parse_authority(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // authority = [ userinfo_and_at ] host [ ":" port ]

    curi_status status = curi_status_success;

    if (status == curi_status_success)
        TRY(status, offset, parse_userinfo_and_at(uri, len, offset, settings, userData));

    if (status == curi_status_success)
        status = parse_host(uri, len, offset, settings, userData);

    if (status == curi_status_success)
    {
        size_t initialOffset = *offset;
        curi_status subStatus = curi_status_success;
        if (subStatus == curi_status_success)
            subStatus = parse_char(':', uri, len, offset, settings, userData);
        if (subStatus == curi_status_success)
            subStatus = parse_port(uri, len, offset, settings, userData);
        if (subStatus == curi_status_error)
            *offset = initialOffset;
        else
            status = subStatus;
    }

    return status;
}